

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O1

double __thiscall HyperGraph::self_inf_cal(HyperGraph *this,Nodelist *vecSeed)

{
  uint uVar1;
  uint *puVar2;
  pointer pvVar3;
  ulong *puVar4;
  size_t sVar5;
  const_iterator __begin1;
  uint *puVar6;
  ulong *puVar7;
  uint *puVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  Nodelist *__range1;
  ulong uVar12;
  undefined1 auVar13 [16];
  vector<bool,_std::allocator<bool>_> vecBoolVst;
  vector<bool,_std::allocator<bool>_> vecBoolSeed;
  allocator_type local_82;
  allocator_type local_81;
  vector<bool,_std::allocator<bool>_> local_80;
  double local_58;
  vector<bool,_std::allocator<bool>_> local_50;
  
  local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_80,this->__numRRsets,(bool *)&local_50,&local_82);
  local_82 = (allocator_type)0x0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_50,(ulong)this->__numV,(bool *)&local_82,&local_81);
  puVar2 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar8 = puVar6; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p[*puVar8 >> 6] =
         local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p[*puVar8 >> 6] | 1L << ((byte)*puVar8 & 0x3f);
  }
  if (puVar6 != puVar2) {
    pvVar3 = (this->_FRsets).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      puVar4 = *(pointer *)
                ((long)&pvVar3[*puVar6].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (puVar7 = pvVar3[*puVar6].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start; puVar7 != puVar4; puVar7 = puVar7 + 1) {
        uVar11 = *puVar7;
        uVar12 = uVar11 + 0x3f;
        if (-1 < (long)uVar11) {
          uVar12 = uVar11;
        }
        local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar12 >> 6) + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar12 >> 6) +
              ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
             1L << ((byte)uVar11 & 0x3f);
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  local_58 = 0.0;
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset != 0 ||
      local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p !=
      local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p) {
    lVar9 = 0;
    uVar11 = 0;
    puVar7 = local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    do {
      lVar9 = lVar9 + (ulong)((*puVar7 >> (uVar11 & 0x3f) & 1) != 0);
      iVar10 = (int)uVar11;
      puVar7 = puVar7 + (iVar10 == 0x3f);
      uVar11 = (ulong)(iVar10 + 1);
      if (iVar10 == 0x3f) {
        uVar11 = 0;
      }
    } while ((uint)uVar11 !=
             local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset ||
             puVar7 != local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
    local_58 = (double)lVar9;
  }
  uVar1 = this->__numV;
  sVar5 = this->__numRRsets;
  if (local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_50.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  auVar13._8_4_ = (int)(sVar5 >> 0x20);
  auVar13._0_8_ = sVar5;
  auVar13._12_4_ = 0x45300000;
  return (local_58 * (double)uVar1) /
         ((auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
}

Assistant:

double self_inf_cal(const Nodelist& vecSeed)
    {
        std::vector<bool> vecBoolVst = std::vector<bool>(__numRRsets);
        std::vector<bool> vecBoolSeed(__numV);
        for (auto seed : vecSeed) vecBoolSeed[seed] = true;
        for (auto seed : vecSeed)
        {
            for (auto node : _FRsets[seed])
            {
                vecBoolVst[node] = true;
            }
        }
        return 1.0 * std::count(vecBoolVst.begin(), vecBoolVst.end(), true) * __numV / __numRRsets;
    }